

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O3

void __thiscall QTapAndHoldGesture::QTapAndHoldGesture(QTapAndHoldGesture *this,QObject *parent)

{
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0xc0);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined4 *)(this_00 + 0x78) = 0x100;
  *(undefined8 *)(this_00 + 0x7c) = 0;
  *(undefined8 *)(this_00 + 0x84) = 0;
  *(undefined8 *)(this_00 + 0x8c) = 0;
  *(undefined8 *)(this_00 + 0x94) = 0;
  *(undefined4 *)(this_00 + 0x9c) = 0;
  this_00[0xa0] = (QObjectPrivate)((byte)this_00[0xa0] & 0xf8);
  *(undefined ***)this_00 = &PTR__QTapAndHoldGesturePrivate_007e6748;
  *(undefined8 *)(this_00 + 0xa8) = 0;
  *(undefined8 *)(this_00 + 0xb0) = 0;
  *(undefined4 *)(this_00 + 0xb8) = 0;
  QObject::QObject((QObject *)this,this_00,parent);
  *(undefined ***)&this->super_QGesture = &PTR_metaObject_007e6220;
  *(undefined4 *)(*(long *)&(this->super_QGesture).field_0x8 + 0x78) = 2;
  return;
}

Assistant:

QTapAndHoldGesture::QTapAndHoldGesture(QObject *parent)
    : QGesture(*new QTapAndHoldGesturePrivate, parent)
{
    d_func()->gestureType = Qt::TapAndHoldGesture;
}